

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_insert(REF_LAYER ref_layer,REF_GRID_conflict ref_grid)

{
  uint uVar1;
  double local_1b0;
  double local_1a8;
  double local_198;
  REF_INT local_18c;
  long local_188;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL has_support;
  REF_DBL zero_tol;
  REF_DBL RStack_108;
  REF_INT zeros;
  REF_DBL bary [4];
  int local_e0;
  REF_INT new_node;
  REF_INT i;
  REF_INT tet;
  REF_INT node3;
  REF_INT node2;
  REF_INT node1;
  REF_INT node0;
  REF_INT nodes [27];
  long local_50;
  REF_GLOB global;
  int local_40;
  REF_INT local;
  REF_INT node;
  REF_INT nnode_per_layer;
  REF_NODE layer_node;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_GRID_conflict ref_grid_local;
  REF_LAYER ref_layer_local;
  
  ref_node = (REF_NODE)ref_grid->cell[8];
  layer_node = ref_grid->node;
  _node = ref_layer->ref_grid->node;
  _ref_private_macro_code_rss = 1e-10;
  local = ref_layer->nnode_per_layer;
  local_40 = 0;
  ref_cell = (REF_CELL)ref_grid;
  ref_grid_local = (REF_GRID_conflict)ref_layer;
  do {
    if (local <= local_40) {
      ref_layer_local._4_4_ = ref_node_rebuild_sorted_global(_node);
      if (ref_layer_local._4_4_ == 0) {
        ref_layer_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x146,"ref_layer_insert",(ulong)ref_layer_local._4_4_,"rebuild");
      }
      return ref_layer_local._4_4_;
    }
    if (((local_40 < 0) || (_node->max <= local_40)) || (_node->global[local_40] < 0)) {
      local_188 = -1;
    }
    else {
      local_188 = _node->global[local_40];
    }
    local_50 = local_188;
    if ((local_188 < 0) || (**(int **)&ref_node->naux <= local_188)) {
      local_18c = -1;
    }
    else {
      local_18c = *(REF_INT *)(*(long *)(*(long *)&ref_node->naux + 8) + local_188 * 4);
    }
    new_node = local_18c;
    global._4_4_ = local_40 + local;
    uVar1 = ref_grid_enclosing_tet
                      ((REF_GRID)ref_cell,_node->real + global._4_4_ * 0xf,&new_node,
                       &stack0xfffffffffffffef8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0xe7,
             "ref_layer_insert",(ulong)uVar1,"enclosing tet");
      return uVar1;
    }
    uVar1 = ref_cell_nodes((REF_CELL)ref_node,new_node,&node1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0xe8,
             "ref_layer_insert",(ulong)uVar1,"nodes");
      return uVar1;
    }
    zero_tol._4_4_ = 0;
    for (local_e0 = 0; local_e0 < 4; local_e0 = local_e0 + 1) {
      if (bary[(long)local_e0 + -1] <= 0.0) {
        local_198 = -bary[(long)local_e0 + -1];
      }
      else {
        local_198 = bary[(long)local_e0 + -1];
      }
      if (local_198 < _ref_private_macro_code_rss) {
        zero_tol._4_4_ = zero_tol._4_4_ + 1;
      }
    }
    bary[3]._4_4_ = -1;
    if (zero_tol._4_4_ == 1) {
      node2 = -1;
      for (local_e0 = 0; local_e0 < 4; local_e0 = local_e0 + 1) {
        if (bary[(long)local_e0 + -1] <= 0.0) {
          local_1b0 = -bary[(long)local_e0 + -1];
        }
        else {
          local_1b0 = bary[(long)local_e0 + -1];
        }
        if (local_1b0 < _ref_private_macro_code_rss) {
          if (node2 != -1) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x11b,"ref_layer_insert","more zeros than nodes");
            return 1;
          }
          node2 = local_e0;
        }
      }
      if (node2 == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x11d,"ref_layer_insert","non-zero node0 missing");
        return 1;
      }
      node3 = ref_node->sorted_local[node2 << 2];
      tet = ref_node->sorted_local[node2 * 4 + 1];
      i = ref_node->sorted_local[node2 * 4 + 2];
      node3 = (&node1)[ref_node->sorted_local[node2 << 2]];
      tet = (&node1)[ref_node->sorted_local[node2 * 4 + 1]];
      i = (&node1)[ref_node->sorted_local[node2 * 4 + 2]];
      uVar1 = ref_geom_supported(*(REF_GEOM *)&ref_cell[2].size_per,
                                 (&node1)[ref_node->sorted_local[node2 << 2]],
                                 &ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x125,"ref_layer_insert",(ulong)uVar1,"got geom?");
        return uVar1;
      }
      if (ref_private_macro_code_rss_1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x126,"ref_layer_insert",6,"add geometry handling");
        return 6;
      }
      uVar1 = ref_geom_supported(*(REF_GEOM *)&ref_cell[2].size_per,tet,
                                 &ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x128,"ref_layer_insert",(ulong)uVar1,"got geom?");
        return uVar1;
      }
      if (ref_private_macro_code_rss_1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x129,"ref_layer_insert",6,"add geometry handling");
        return 6;
      }
      uVar1 = ref_geom_supported(*(REF_GEOM *)&ref_cell[2].size_per,i,&ref_private_macro_code_rss_1)
      ;
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",299
               ,"ref_layer_insert",(ulong)uVar1,"got geom?");
        return uVar1;
      }
      if (ref_private_macro_code_rss_1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",300
               ,"ref_layer_insert",6,"add geometry handling");
        return 6;
      }
      uVar1 = ref_node_next_global(layer_node,&local_50);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x12d,"ref_layer_insert",(ulong)uVar1,"next global");
        return uVar1;
      }
      uVar1 = ref_node_add(layer_node,local_50,(REF_INT *)((long)bary + 0x1c));
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x12e,"ref_layer_insert",(ulong)uVar1,"new node");
        return uVar1;
      }
      uVar1 = ref_node_interpolate_face(layer_node,node3,tet,i,bary[3]._4_4_);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x130,"ref_layer_insert",(ulong)uVar1,"interp new node");
        return uVar1;
      }
      for (local_e0 = 0; local_e0 < 3; local_e0 = local_e0 + 1) {
        layer_node->real[local_e0 + bary[3]._4_4_ * 0xf] =
             _node->real[local_e0 + global._4_4_ * 0xf];
      }
      uVar1 = ref_split_face((REF_GRID_conflict)ref_cell,node3,tet,i,bary[3]._4_4_);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x134,"ref_layer_insert",(ulong)uVar1,"fsplit");
        return uVar1;
      }
      if (*(int *)((long)ref_grid_local->cell + 4) != 0) {
        printf("split zeros %d bary %f %f %f %f\n",RStack_108,bary[0],bary[1],bary[2],
               (ulong)zero_tol._4_4_);
      }
    }
    else {
      if (zero_tol._4_4_ != 2) {
        if (*(int *)((long)ref_grid_local->cell + 4) != 0) {
          printf("implement zeros %d bary %f %f %f %f\n",RStack_108,bary[0],bary[1],bary[2],
                 (ulong)zero_tol._4_4_);
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x13d,"ref_layer_insert",6,"missing a general case");
        return 6;
      }
      node2 = -1;
      node3 = -1;
      for (local_e0 = 0; local_e0 < 4; local_e0 = local_e0 + 1) {
        if (bary[(long)local_e0 + -1] <= 0.0) {
          local_1a8 = -bary[(long)local_e0 + -1];
        }
        else {
          local_1a8 = bary[(long)local_e0 + -1];
        }
        if (_ref_private_macro_code_rss <= local_1a8) {
          if (node2 == -1) {
            node2 = local_e0;
          }
          else {
            if (node3 != -1) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0xfb,"ref_layer_insert","more non-zeros than nodes");
              return 1;
            }
            node3 = local_e0;
          }
        }
      }
      if (node2 == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0xfd,"ref_layer_insert","non-zero node0 missing");
        return 1;
      }
      if (node3 == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0xfe,"ref_layer_insert","non-zero node1 missing");
        return 1;
      }
      node2 = (&node1)[node2];
      node3 = (&node1)[node3];
      uVar1 = ref_geom_supported(*(REF_GEOM *)&ref_cell[2].size_per,node3,
                                 &ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x102,"ref_layer_insert",(ulong)uVar1,"got geom?");
        return uVar1;
      }
      if (ref_private_macro_code_rss_1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x103,"ref_layer_insert",6,"add geometry handling");
        return 6;
      }
      uVar1 = ref_geom_supported(*(REF_GEOM *)&ref_cell[2].size_per,node2,
                                 &ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x105,"ref_layer_insert",(ulong)uVar1,"got geom?");
        return uVar1;
      }
      if (ref_private_macro_code_rss_1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x106,"ref_layer_insert",6,"add geometry handling");
        return 6;
      }
      uVar1 = ref_node_next_global(layer_node,&local_50);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x107,"ref_layer_insert",(ulong)uVar1,"next global");
        return uVar1;
      }
      uVar1 = ref_node_add(layer_node,local_50,(REF_INT *)((long)bary + 0x1c));
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x108,"ref_layer_insert",(ulong)uVar1,"new node");
        return uVar1;
      }
      uVar1 = ref_node_interpolate_edge(layer_node,node2,node3,0.5,bary[3]._4_4_);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x10a,"ref_layer_insert",(ulong)uVar1,"interp new node");
        return uVar1;
      }
      uVar1 = ref_geom_add_between((REF_GRID)ref_cell,node2,node3,0.5,bary[3]._4_4_);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x10c,"ref_layer_insert",(ulong)uVar1,"geom new node");
        return uVar1;
      }
      uVar1 = ref_geom_constrain((REF_GRID)ref_cell,bary[3]._4_4_);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x10d,"ref_layer_insert",(ulong)uVar1,"geom constraint");
        return uVar1;
      }
      uVar1 = ref_split_edge((REF_GRID_conflict)ref_cell,node2,node3,bary[3]._4_4_);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x10e,"ref_layer_insert",(ulong)uVar1,"split");
        return uVar1;
      }
      for (local_e0 = 0; local_e0 < 3; local_e0 = local_e0 + 1) {
        layer_node->real[local_e0 + bary[3]._4_4_ * 0xf] =
             _node->real[local_e0 + global._4_4_ * 0xf];
      }
    }
    if (bary[3]._4_4_ == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x140
             ,"ref_layer_insert","new_node not set");
      return 1;
    }
    _node->global[global._4_4_] = (long)bary[3]._4_4_;
    if ((*(int *)((long)ref_grid_local->cell + 4) != 0) &&
       (uVar1 = ref_validation_cell_volume((REF_GRID)ref_cell), uVar1 != 0)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x143
             ,"ref_layer_insert",(ulong)uVar1,"vol");
      return uVar1;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_layer_insert(REF_LAYER ref_layer, REF_GRID ref_grid) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_NODE layer_node = ref_grid_node(ref_layer_grid(ref_layer));
  REF_INT nnode_per_layer, node, local;
  REF_GLOB global;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], node0, node1, node2, node3;
  REF_INT tet, i, new_node;
  REF_DBL bary[4];
  REF_INT zeros;
  REF_DBL zero_tol = 1.0e-10;
  REF_BOOL has_support;

  nnode_per_layer = ref_layer->nnode_per_layer;

  for (node = 0; node < nnode_per_layer; node++) {
    global = ref_node_global(layer_node, node); /* base */
    tet = ref_adj_first(ref_cell_adj(ref_cell), global);
    local = node + nnode_per_layer; /* target */
    RSS(ref_grid_enclosing_tet(ref_grid, ref_node_xyz_ptr(layer_node, local),
                               &tet, bary),
        "enclosing tet");
    RSS(ref_cell_nodes(ref_cell, tet, nodes), "nodes");
    zeros = 0;
    for (i = 0; i < 4; i++)
      if (ABS(bary[i]) < zero_tol) zeros++;
    new_node = REF_EMPTY;
    switch (zeros) {
      case 2: /* split an edge */
        node0 = REF_EMPTY;
        node1 = REF_EMPTY;
        for (i = 0; i < 4; i++)
          if (ABS(bary[i]) >= zero_tol) {
            if (node0 == REF_EMPTY) {
              node0 = i;
              continue;
            }
            if (node1 == REF_EMPTY) {
              node1 = i;
              continue;
            }
            THROW("more non-zeros than nodes");
          }
        if (node0 == REF_EMPTY) THROW("non-zero node0 missing");
        if (node1 == REF_EMPTY) THROW("non-zero node1 missing");
        node0 = nodes[node0];
        node1 = nodes[node1];
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node1, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node0, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &new_node), "new node");
        RSS(ref_node_interpolate_edge(ref_node, node0, node1, 0.5, new_node),
            "interp new node");
        RSS(ref_geom_add_between(ref_grid, node0, node1, 0.5, new_node),
            "geom new node");
        RSS(ref_geom_constrain(ref_grid, new_node), "geom constraint");
        RSS(ref_split_edge(ref_grid, node0, node1, new_node), "split");
        for (i = 0; i < 3; i++)
          ref_node_xyz(ref_node, i, new_node) =
              ref_node_xyz(layer_node, i, local);
        break;
      case 1: /* split a triangular face*/
        node0 = REF_EMPTY;
        for (i = 0; i < 4; i++)
          if (ABS(bary[i]) < zero_tol) {
            if (node0 == REF_EMPTY) {
              node0 = i;
              continue;
            }
            THROW("more zeros than nodes");
          }
        if (node0 == REF_EMPTY) THROW("non-zero node0 missing");
        node1 = ref_cell_f2n_gen(ref_cell, 0, node0);
        node2 = ref_cell_f2n_gen(ref_cell, 1, node0);
        node3 = ref_cell_f2n_gen(ref_cell, 2, node0);
        node1 = nodes[node1];
        node2 = nodes[node2];
        node3 = nodes[node3];
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node1, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node2, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node3, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &new_node), "new node");
        RSS(ref_node_interpolate_face(ref_node, node1, node2, node3, new_node),
            "interp new node");
        for (i = 0; i < 3; i++)
          ref_node_xyz(ref_node, i, new_node) =
              ref_node_xyz(layer_node, i, local);
        RSS(ref_split_face(ref_grid, node1, node2, node3, new_node), "fsplit");
        if (ref_layer->verbose)
          printf("split zeros %d bary %f %f %f %f\n", zeros, bary[0], bary[1],
                 bary[2], bary[3]);
        break;
      default:
        if (ref_layer->verbose)
          printf("implement zeros %d bary %f %f %f %f\n", zeros, bary[0],
                 bary[1], bary[2], bary[3]);
        RSS(REF_IMPLEMENT, "missing a general case");
        break;
    }
    RAS(REF_EMPTY != new_node, "new_node not set");
    layer_node->global[local] = new_node;

    if (ref_layer->verbose) RSS(ref_validation_cell_volume(ref_grid), "vol");
  }

  RSS(ref_node_rebuild_sorted_global(layer_node), "rebuild");

  return REF_SUCCESS;
}